

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_PrintToTest_x_iutest_x_U32String_Test::Body
          (iu_PrintToTest_x_iutest_x_U32String_Test *this)

{
  Fixed *fixed;
  AssertionHelper local_1d8;
  Fixed local_198;
  iu_PrintToTest_x_iutest_x_U32String_Test *local_10;
  iu_PrintToTest_x_iutest_x_U32String_Test *this_local;
  
  local_10 = this;
  memset(&local_198,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_198);
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_198,(char32_t (*) [5])L"TEST");
  iutest::AssertionHelper::AssertionHelper
            (&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x418,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_1d8,fixed);
  iutest::AssertionHelper::~AssertionHelper(&local_1d8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_198);
  return;
}

Assistant:

IUTEST(PrintToTest, U32String)
{
    IUTEST_SUCCEED() << U"TEST";
}